

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

void probe_stack(char *sp0,size_t sz,size_t pgsz)

{
  undefined8 local_30;
  size_t i;
  char *sp;
  size_t pgsz_local;
  size_t sz_local;
  char *sp0_local;
  
  i = (size_t)sp0;
  for (local_30 = 0; local_30 < sz; local_30 = pgsz + local_30) {
    *(undefined8 *)i = *(undefined8 *)i;
    i = i - pgsz;
  }
  _probe_stack_weak_dummy(sp0,sz);
  return;
}

Assistant:

HU_NOINLINE
static void
probe_stack(volatile char *sp0, size_t sz, size_t pgsz)
{
    volatile char *sp = sp0;
#if HU_COMP_GNUC_P
    __asm__ __volatile__("" : : "r"(sp) : "memory");
#endif
    size_t i = 0;
    while (i < sz) {
        *(volatile uintptr_t *) sp |= (uintptr_t) 0;
        i += pgsz;
        sp -= pgsz;
    }

#ifdef HAVE_probe_stack_weak_dummy
    _probe_stack_weak_dummy(sp0, sz);
#endif
}